

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellReissner4::SetupInitial(ChElementShellReissner4 *this,ChSystem *system)

{
  ChVector<double> *v;
  non_const_type pMVar1;
  long *plVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  ChVector<double> *der2;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  ChLoadableUVW CVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  undefined8 uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  long lVar37;
  Scalar *pSVar38;
  int ii;
  ChMatrix33<double> *pCVar39;
  long lVar40;
  int n_1;
  ChMatrix33<double> *pCVar41;
  double *pdVar42;
  int n;
  long lVar43;
  undefined **ppuVar44;
  ChVector<double> *pCVar45;
  long lVar46;
  bool bVar47;
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  Scalar SVar50;
  double dVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  ChVector<double> y_A_1;
  ChMatrixNM<double,_4,_2> L_alpha_B_i;
  ChVector<double> y_A_2;
  ChVector<double> x_2_1;
  ChVector<double> x_1_1;
  ChMatrixNM<double,_2,_2> xi_i_i;
  ChVector<double> x_2;
  ChVector<double> x_1;
  ChMatrixNM<double,_4,_IDOFS> tmpP;
  ChMatrixNM<double,_4,_4> M_0_Inv;
  ChMatrixNM<double,_4,_4> M_0;
  undefined1 local_610 [80];
  undefined1 local_5c0 [104];
  pointer psStack_558;
  pointer local_550;
  pointer local_548;
  pointer local_530;
  pointer local_528;
  double local_520;
  double local_518;
  double local_510;
  double local_508;
  Matrix<double,_2,_2,_1,_2,_2> local_500;
  undefined1 local_4e0 [224];
  Matrix<double,_4,_2,_1,_4,_2> local_400;
  double local_388;
  double local_378;
  undefined1 local_260 [352];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  SetAsNeutral(this);
  ComputeInitialNodeOrientation(this);
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>>
            (&(this->T0_overline).super_Matrix<double,_3,_3,_1,_3,_3>,
             &(this->T_overline).super_Matrix<double,_3,_3,_1,_3,_3>);
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>>
            (&(this->T_0_0).super_Matrix<double,_3,_3,_1,_3,_3>,
             &(this->T_0).super_Matrix<double,_3,_3,_1,_3,_3>);
  v = this->xa;
  for (lVar37 = 0x2538; lVar37 != 0x2598; lVar37 = lVar37 + 0x18) {
    puVar3 = (undefined8 *)((long)this + lVar37 + -0x10);
    uVar34 = puVar3[1];
    puVar4 = (undefined8 *)((long)this + lVar37 + -0x70);
    *puVar4 = *puVar3;
    puVar4[1] = uVar34;
    *(undefined8 *)((long)this + lVar37 + -0x60) =
         *(undefined8 *)
          ((long)&(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
                  _vptr_ChElementBase + lVar37);
  }
  pCVar41 = this->T_0_i;
  lVar37 = 4;
  pCVar39 = pCVar41;
  while (bVar47 = lVar37 != 0, lVar37 = lVar37 + -1, bVar47) {
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>>
              (&pCVar39->super_Matrix<double,_3,_3,_1,_3,_3>,
               &pCVar39[9].super_Matrix<double,_3,_3,_1,_3,_3>);
    pCVar39 = pCVar39 + 1;
  }
  local_610._64_8_ = this->T_A;
  pCVar39 = this->T_0_A;
  lVar37 = 4;
  local_610._56_8_ = pCVar39;
  while (bVar47 = lVar37 != 0, lVar37 = lVar37 + -1, bVar47) {
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>>
              (&pCVar39->super_Matrix<double,_3,_3,_1,_3,_3>,
               &pCVar39[9].super_Matrix<double,_3,_3,_1,_3,_3>);
    pCVar39 = pCVar39 + 1;
  }
  InterpDeriv_xi1(v,(double *)xi_0);
  InterpDeriv_xi2(v,(double *)xi_0);
  auVar22._8_8_ =
       local_400.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.m_data.array
       [2];
  auVar22._0_8_ =
       local_400.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.m_data.array
       [1];
  auVar25 = vpermpd_avx2(*(undefined1 (*) [32])
                          ((this->T_0_0).super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 3),0x50);
  auVar23._8_8_ =
       local_400.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.m_data.array
       [1];
  auVar23._0_8_ =
       local_400.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.m_data.array
       [0];
  auVar26 = vpermpd_avx2(*(undefined1 (*) [32])
                          (this->T_0_0).super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array,0x50);
  auVar27 = vpermpd_avx2(*(undefined1 (*) [32])
                          ((this->T_0_0).super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 6),0x50);
  local_260._0_8_ = local_100;
  auVar22 = vmovhpd_avx(auVar22,local_4e0._8_8_);
  auVar23 = vmovhpd_avx(auVar23,local_4e0._0_8_);
  auVar28 = vpermpd_avx2(ZEXT1632(auVar22),0x44);
  auVar29 = vpermpd_avx2(ZEXT1632(auVar23),0x44);
  auVar63._0_8_ = auVar25._0_8_ * auVar28._0_8_;
  auVar63._8_8_ = auVar25._8_8_ * auVar28._8_8_;
  auVar63._16_8_ = auVar25._16_8_ * auVar28._16_8_;
  auVar63._24_8_ = auVar25._24_8_ * auVar28._24_8_;
  auVar23 = vfmadd213pd_fma(auVar29,auVar26,auVar63);
  auVar52._8_8_ = 0;
  auVar52._0_8_ =
       local_400.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.m_data.array
       [2];
  auVar22 = vmovhpd_avx(auVar52,local_4e0._16_8_);
  auVar25 = vpermpd_avx2(ZEXT1632(auVar22),0x44);
  auVar52 = vfmadd213pd_fma(auVar25,auVar27,ZEXT1632(auVar23));
  auVar22 = vshufpd_avx(auVar52,auVar52,1);
  auVar48 = vpermpd_avx512f(_DAT_00f14480,ZEXT1664(auVar52));
  *(undefined1 (*) [32])
   (this->S_alpha_beta_0).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.
   m_data.array = ZEXT1632(auVar52);
  auVar49 = _DAT_00f144c0;
  auVar23 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,1);
  auVar25 = vpermpd_avx2(ZEXT1632(auVar52),0x1e);
  auVar64._8_8_ = 0;
  auVar64._0_8_ = auVar22._0_8_ * 0.0;
  auVar22 = vfmsub231sd_fma(auVar64,auVar52,auVar23);
  this->alpha_0 = auVar22._0_8_;
  auVar49 = vpermpd_avx512f(auVar49,ZEXT1664(auVar52));
  local_100 = vmulpd_avx512f(auVar48,auVar49);
  local_c0 = vpermpd_avx512f(_DAT_00f14500,
                             ZEXT3264(CONCAT824(auVar25._24_8_ * 0.0,
                                                CONCAT816(auVar25._16_8_ * 0.0,
                                                          CONCAT88(auVar52._8_8_ * auVar25._8_8_,
                                                                   auVar52._0_8_ * auVar25._0_8_))))
                            );
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,4,4,1,4,4>,Eigen::Inverse<Eigen::Matrix<double,4,4,1,4,4>>>
            ((Matrix<double,_4,_4,_1,_4,_4> *)(local_260 + 0xe0),
             (Inverse<Eigen::Matrix<double,_4,_4,_1,_4,_4>_> *)local_260);
  for (lVar37 = 0; lVar37 != 4; lVar37 = lVar37 + 1) {
    pdVar42 = (double *)(&xi_i + lVar37 * 2);
    InterpDeriv_xi1(v,pdVar42);
    InterpDeriv_xi2(v,pdVar42);
    auVar53._8_8_ = 0;
    auVar53._0_8_ = local_518;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = local_508;
    local_400.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.m_data.array[0]
         = (double)(this->S_alpha_beta_i + lVar37);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = pCVar41[lVar37].super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0];
    auVar65._8_8_ = 0;
    auVar65._0_8_ =
         local_510 *
         this->T_0_i[lVar37].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar22 = vfmadd231sd_fma(auVar65,auVar53,auVar6);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = this->T_0_i[lVar37].super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[6];
    auVar22 = vfmadd231sd_fma(auVar22,auVar68,auVar7);
    this->S_alpha_beta_i[lVar37].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.
    m_storage.m_data.array[0] = auVar22._0_8_;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = this->T_0_i[lVar37].super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[1];
    auVar60._8_8_ = 0;
    auVar60._0_8_ =
         local_510 *
         this->T_0_i[lVar37].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar23 = vfmadd231sd_fma(auVar60,auVar53,auVar8);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = this->T_0_i[lVar37].super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[7];
    auVar23 = vfmadd231sd_fma(auVar23,auVar68,auVar9);
    this->S_alpha_beta_i[lVar37].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.
    m_storage.m_data.array[2] = auVar23._0_8_;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = local_530;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = local_520;
    auVar10._8_8_ = 0;
    auVar10._0_8_ =
         pCVar41[lVar37].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar72._8_8_ = 0;
    auVar72._0_8_ =
         (double)local_528 *
         this->T_0_i[lVar37].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar52 = vfmadd231sd_fma(auVar72,auVar54,auVar10);
    auVar11._8_8_ = 0;
    auVar11._0_8_ =
         this->T_0_i[lVar37].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar52 = vfmadd231sd_fma(auVar52,auVar73,auVar11);
    this->S_alpha_beta_i[lVar37].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.
    m_storage.m_data.array[1] = auVar52._0_8_;
    auVar12._8_8_ = 0;
    auVar12._0_8_ =
         this->T_0_i[lVar37].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar69._8_8_ = 0;
    auVar69._0_8_ =
         (double)local_528 *
         this->T_0_i[lVar37].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar64 = vfmadd231sd_fma(auVar69,auVar54,auVar12);
    auVar13._8_8_ = 0;
    auVar13._0_8_ =
         this->T_0_i[lVar37].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar64 = vfmadd231sd_fma(auVar64,auVar73,auVar13);
    auVar55._8_8_ = 0;
    auVar55._0_8_ = auVar23._0_8_ * auVar52._0_8_;
    auVar22 = vfmsub231sd_fma(auVar55,auVar22,auVar64);
    this->S_alpha_beta_i[lVar37].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.
    m_storage.m_data.array[3] = auVar64._0_8_;
    this->alpha_i[lVar37] = auVar22._0_8_;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,2,2,1,2,2>,Eigen::Inverse<Eigen::Matrix<double,2,2,1,2,2>>>
              (&local_500,(Inverse<Eigen::Matrix<double,_2,_2,_1,_2,_2>_> *)&local_400);
    ppuVar44 = &LI_J;
    for (lVar43 = 0; lVar43 != 4; lVar43 = lVar43 + 1) {
      for (lVar40 = 0; lVar40 != 2; lVar40 = lVar40 + 1) {
        SVar50 = (Scalar)(*(code *)ppuVar44[lVar40])(pdVar42);
        pSVar38 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>,_1> *)local_5c0,
                             lVar43,lVar40);
        *pSVar38 = SVar50;
      }
      ppuVar44 = ppuVar44 + 2;
    }
    local_400.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.m_data.array[1]
         = (double)&local_500;
    local_400.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.m_data.array[0]
         = (double)local_5c0;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,2,1,4,2>,Eigen::Product<Eigen::Matrix<double,4,2,1,4,2>,Eigen::Matrix<double,2,2,1,2,2>,0>>
              (this->L_alpha_beta_i + lVar37,
               (Product<Eigen::Matrix<double,_4,_2,_1,_4,_2>,_Eigen::Matrix<double,_2,_2,_1,_2,_2>,_0>
                *)&local_400);
    CVar24 = (ChLoadableUVW)(*pdVar42 * (double)(&DAT_011df688)[lVar37 * 2]);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_7,_1,_4,_7>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_4,_7,_1,_4,_7>_> *)local_4e0);
    local_4e0._0_8_ = *pdVar42;
    local_4e0._72_8_ = *(ChLoadableUV *)(&DAT_011df688 + lVar37 * 2);
    local_4e0._8_8_ = CVar24;
    local_4e0._80_8_ = CVar24;
    local_4e0._144_8_ = local_4e0._0_8_;
    local_4e0._152_8_ = CVar24;
    local_4e0._208_8_ = CVar24;
    local_4e0._216_8_ = local_4e0._72_8_;
    Eigen::DenseBase<Eigen::Matrix<double,_12,_4,_1,_12,_4>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_12,_4,_1,_12,_4>_> *)&local_400);
    local_610._0_8_ = local_260 + 0xe0;
    local_400.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.m_data.array[0]
         = (double)&DAT_3ff0000000000000;
    local_400.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.m_data.array[6]
         = 1.0;
    local_388 = 1.0;
    local_378 = 1.0;
    local_610._8_8_ = (DenseBase<Eigen::Matrix<double,_4,_7,_1,_4,_7>_> *)local_4e0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,4,7,1,4,7>>::
    _set_noalias<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,4,4,1,4,4>>,Eigen::Matrix<double,4,7,1,4,7>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,4,7,1,4,7>> *)local_260,
               (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>,_Eigen::Matrix<double,_4,_7,_1,_4,_7>,_0>_>
                *)local_610);
    local_610._72_8_ = this->alpha_0 / this->alpha_i[lVar37];
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_4,_1,_12,_4>_>,_const_Eigen::Matrix<double,_12,_4,_1,_12,_4>_>
                      *)(local_5c0 + 0x60),(double *)(local_610 + 0x48),
                     (StorageBaseType *)&local_400);
    local_610._16_8_ = local_550;
    local_610._24_8_ = local_548;
    local_610._40_8_ = (PlainObjectBase<Eigen::Matrix<double,4,7,1,4,7>> *)local_260;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,12,7,1,12,7>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,12,4,1,12,4>const>const,Eigen::Matrix<double,12,4,1,12,4>const>,Eigen::Matrix<double,4,7,1,4,7>,0>>
              (this->P_i + lVar37,
               (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_4,_1,_12,_4>_>,_const_Eigen::Matrix<double,_12,_4,_1,_12,_4>_>,_Eigen::Matrix<double,_4,_7,_1,_4,_7>,_0>
                *)local_610);
  }
  ComputeIPCurvature(this);
  lVar40 = 0x2d80;
  lVar37 = 0x4ac0;
  for (lVar43 = 0; lVar43 != 0x60; lVar43 = lVar43 + 0x18) {
    pCVar45 = (ChVector<double> *)((long)this->y_i_1[0].m_data + lVar43);
    der2 = (ChVector<double> *)((long)this->y_i_2[0].m_data + lVar43);
    InterpDeriv(v,(ChMatrixNM<double,_4,_2> *)
                  ((long)&(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
                          _vptr_ChElementBase + lVar37),pCVar45,der2);
    pCVar41 = (ChMatrix33<double> *)
              ((long)&(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
                      _vptr_ChElementBase + lVar40);
    local_4e0._0_8_ = pCVar41;
    chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_4e0,pCVar45);
    if ((Matrix<double,_4,_2,_1,_4,_2> *)((long)this->eps_tilde_1_0_i[0].m_data + lVar43) !=
        &local_400) {
      puVar3 = (undefined8 *)((long)this->eps_tilde_1_0_i[0].m_data + lVar43);
      *puVar3 = local_400.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
                m_data.array[0];
      puVar3[1] = local_400.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
                  m_data.array[1];
      *(double *)((long)this->eps_tilde_1_0_i[0].m_data + lVar43 + 0x10) =
           local_400.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.m_data.
           array[2];
    }
    local_4e0._0_8_ = pCVar41;
    chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_4e0,der2);
    if ((Matrix<double,_4,_2,_1,_4,_2> *)((long)this->eps_tilde_2_0_i[0].m_data + lVar43) !=
        &local_400) {
      puVar3 = (undefined8 *)((long)this->eps_tilde_2_0_i[0].m_data + lVar43);
      *puVar3 = local_400.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
                m_data.array[0];
      puVar3[1] = local_400.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
                  m_data.array[1];
      *(double *)((long)this->eps_tilde_2_0_i[0].m_data + lVar43 + 0x10) =
           local_400.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.m_data.
           array[2];
    }
    local_4e0._0_8_ = pCVar41;
    chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_4e0,
                      (ChVector<double> *)((long)this->k_1_i[0].m_data + lVar43));
    if ((Matrix<double,_4,_2,_1,_4,_2> *)((long)this->k_tilde_1_0_i[0].m_data + lVar43) !=
        &local_400) {
      puVar3 = (undefined8 *)((long)this->k_tilde_1_0_i[0].m_data + lVar43);
      *puVar3 = local_400.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
                m_data.array[0];
      puVar3[1] = local_400.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
                  m_data.array[1];
      *(double *)((long)this->k_tilde_1_0_i[0].m_data + lVar43 + 0x10) =
           local_400.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.m_data.
           array[2];
    }
    local_4e0._0_8_ = pCVar41;
    chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_4e0,
                      (ChVector<double> *)((long)this->k_2_i[0].m_data + lVar43));
    if ((Matrix<double,_4,_2,_1,_4,_2> *)((long)this->k_tilde_2_0_i[0].m_data + lVar43) !=
        &local_400) {
      puVar3 = (undefined8 *)((long)this->k_tilde_2_0_i[0].m_data + lVar43);
      *puVar3 = local_400.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
                m_data.array[0];
      puVar3[1] = local_400.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
                  m_data.array[1];
      *(double *)((long)this->k_tilde_2_0_i[0].m_data + lVar43 + 0x10) =
           local_400.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.m_data.
           array[2];
    }
    lVar40 = lVar40 + 0x48;
    lVar37 = lVar37 + 0x40;
  }
  local_610._48_8_ = this->eps_tilde_2_0_A;
  for (lVar37 = 0; lVar37 != 4; lVar37 = lVar37 + 1) {
    pdVar42 = (double *)(xi_A + lVar37 * 0x10);
    InterpDeriv_xi1(v,pdVar42);
    InterpDeriv_xi2(v,pdVar42);
    auVar56._8_8_ = 0;
    auVar56._0_8_ = local_260._0_8_;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = local_260._16_8_;
    auVar14._8_8_ = 0;
    auVar14._0_8_ =
         (((ChMatrix33<double> *)(local_610._56_8_ + lVar37 * 0x48))->
         super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar66._8_8_ = 0;
    auVar66._0_8_ =
         (double)local_260._8_8_ *
         (((ChMatrix33<double> *)(local_610._56_8_ + lVar37 * 0x48))->
         super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar22 = vfmadd231sd_fma(auVar66,auVar56,auVar14);
    auVar15._8_8_ = 0;
    auVar15._0_8_ =
         (((ChMatrix33<double> *)(local_610._56_8_ + lVar37 * 0x48))->
         super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar22 = vfmadd231sd_fma(auVar22,auVar70,auVar15);
    this->S_alpha_beta_A[lVar37].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.
    m_storage.m_data.array[0] = auVar22._0_8_;
    auVar16._8_8_ = 0;
    auVar16._0_8_ =
         (((ChMatrix33<double> *)(local_610._56_8_ + lVar37 * 0x48))->
         super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar61._8_8_ = 0;
    auVar61._0_8_ =
         (double)local_260._8_8_ *
         (((ChMatrix33<double> *)(local_610._56_8_ + lVar37 * 0x48))->
         super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar22 = vfmadd231sd_fma(auVar61,auVar56,auVar16);
    auVar17._8_8_ = 0;
    auVar17._0_8_ =
         (((ChMatrix33<double> *)(local_610._56_8_ + lVar37 * 0x48))->
         super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar22 = vfmadd231sd_fma(auVar22,auVar70,auVar17);
    this->S_alpha_beta_A[lVar37].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.
    m_storage.m_data.array[2] = auVar22._0_8_;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = local_5c0._0_8_;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = local_5c0._16_8_;
    auVar18._8_8_ = 0;
    auVar18._0_8_ =
         (((ChMatrix33<double> *)(local_610._56_8_ + lVar37 * 0x48))->
         super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar67._8_8_ = 0;
    auVar67._0_8_ =
         (double)local_5c0._8_8_ *
         (((ChMatrix33<double> *)(local_610._56_8_ + lVar37 * 0x48))->
         super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar22 = vfmadd231sd_fma(auVar67,auVar57,auVar18);
    auVar19._8_8_ = 0;
    auVar19._0_8_ =
         (((ChMatrix33<double> *)(local_610._56_8_ + lVar37 * 0x48))->
         super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar22 = vfmadd231sd_fma(auVar22,auVar71,auVar19);
    this->S_alpha_beta_A[lVar37].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.
    m_storage.m_data.array[1] = auVar22._0_8_;
    auVar20._8_8_ = 0;
    auVar20._0_8_ =
         (((ChMatrix33<double> *)(local_610._56_8_ + lVar37 * 0x48))->
         super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar62._8_8_ = 0;
    auVar62._0_8_ =
         (double)local_5c0._8_8_ *
         (((ChMatrix33<double> *)(local_610._56_8_ + lVar37 * 0x48))->
         super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar22 = vfmadd231sd_fma(auVar62,auVar57,auVar20);
    auVar21._8_8_ = 0;
    auVar21._0_8_ =
         (((ChMatrix33<double> *)(local_610._56_8_ + lVar37 * 0x48))->
         super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar22 = vfmadd231sd_fma(auVar22,auVar71,auVar21);
    this->S_alpha_beta_A[lVar37].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.
    m_storage.m_data.array[3] = auVar22._0_8_;
    local_610._16_8_ = 0.0;
    local_550 = (pointer)0x0;
    local_610._0_8_ = (_func_int **)0x0;
    local_610._8_8_ = (DenseBase<Eigen::Matrix<double,_4,_7,_1,_4,_7>_> *)0x0;
    local_5c0._96_8_ = (pointer)0x0;
    psStack_558 = (pointer)0x0;
    InterpDeriv(v,this->L_alpha_beta_A + lVar37,(ChVector<double> *)local_610,
                (ChVector<double> *)(local_5c0 + 0x60));
    pCVar41 = (ChMatrix33<double> *)(local_610._64_8_ + lVar37 * 0x48);
    local_4e0._0_8_ = pCVar41;
    chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_4e0,
                      (ChVector<double> *)local_610);
    pCVar45 = this->eps_tilde_1_0_A + lVar37;
    if (&local_400 != (Matrix<double,_4,_2,_1,_4,_2> *)pCVar45) {
      (((PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_> *)pCVar45->m_data)->m_storage).
      m_data.array[0] =
           local_400.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.m_data.
           array[0];
      (((PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_> *)pCVar45->m_data)->m_storage).
      m_data.array[1] =
           local_400.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.m_data.
           array[1];
      (((PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_> *)pCVar45->m_data)->m_storage).
      m_data.array[2] =
           local_400.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.m_data.
           array[2];
    }
    local_4e0._0_8_ = pCVar41;
    chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_4e0,
                      (ChVector<double> *)(local_5c0 + 0x60));
    pCVar45 = (ChVector<double> *)(local_610._48_8_ + lVar37 * 0x18);
    if (&local_400 != (Matrix<double,_4,_2,_1,_4,_2> *)pCVar45) {
      (((PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_> *)pCVar45->m_data)->m_storage).
      m_data.array[0] =
           local_400.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.m_data.
           array[0];
      (((PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_> *)pCVar45->m_data)->m_storage).
      m_data.array[1] =
           local_400.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.m_data.
           array[1];
      (((PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_> *)pCVar45->m_data)->m_storage).
      m_data.array[2] =
           local_400.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.m_data.
           array[2];
    }
    local_400.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.m_data.array[0]
         = (double)(this->S_alpha_beta_A + lVar37);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,2,2,1,2,2>,Eigen::Inverse<Eigen::Matrix<double,2,2,1,2,2>>>
              ((Matrix<double,_2,_2,_1,_2,_2> *)local_4e0,
               (Inverse<Eigen::Matrix<double,_2,_2,_1,_2,_2>_> *)&local_400);
    ppuVar44 = &LI_J;
    for (lVar43 = 0; lVar43 != 4; lVar43 = lVar43 + 1) {
      for (lVar40 = 0; lVar40 != 2; lVar40 = lVar40 + 1) {
        SVar50 = (Scalar)(*(code *)ppuVar44[lVar40])(pdVar42);
        pSVar38 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>,_1> *)&local_400,
                             lVar43,lVar40);
        *pSVar38 = SVar50;
      }
      ppuVar44 = ppuVar44 + 2;
    }
    local_500.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.m_data.array[0]
         = (double)&local_400;
    local_500.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.m_data.array[1]
         = (double)local_4e0;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,2,1,4,2>,Eigen::Product<Eigen::Matrix<double,4,2,1,4,2>,Eigen::Matrix<double,2,2,1,2,2>,0>>
              (this->L_alpha_beta_A + lVar37,
               (Product<Eigen::Matrix<double,_4,_2,_1,_4,_2>,_Eigen::Matrix<double,_2,_2,_1,_2,_2>,_0>
                *)&local_500);
  }
  lVar40 = 0x4580;
  lVar43 = 0x45e0;
  lVar46 = 0x2ea0;
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.m_data.array[2] =
       0.0;
  local_4e0._16_8_ = (double *)0x0;
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.m_data.array[0] =
       0.0;
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.m_data.array[1] =
       0.0;
  local_4e0._0_8_ = (non_const_type)0x0;
  local_4e0._8_8_ = (_func_int **)0x0;
  for (lVar37 = 0x4bc0; lVar37 != 0x4cc0; lVar37 = lVar37 + 0x40) {
    InterpDeriv(v,(ChMatrixNM<double,_4,_2> *)
                  ((long)&(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
                          _vptr_ChElementBase + lVar37),(ChVector<double> *)&local_400,
                (ChVector<double> *)local_4e0);
    pMVar1 = (non_const_type)
             ((long)&(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
                     _vptr_ChElementBase + lVar46);
    local_5c0._0_8_ = pMVar1;
    chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_5c0,
                      (ChVector<double> *)&local_400);
    if ((undefined1 *)
        ((long)&(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
                _vptr_ChElementBase + lVar40) != local_260) {
      plVar2 = (long *)((long)&(this->super_ChElementShell).super_ChElementGeneric.
                               super_ChElementBase._vptr_ChElementBase + lVar40);
      *plVar2 = local_260._0_8_;
      plVar2[1] = local_260._8_8_;
      *(undefined8 *)
       ((long)&(this->super_ChElementShell).super_ChElementGeneric.Kmatr.K.
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data +
       lVar40) = local_260._16_8_;
    }
    local_5c0._0_8_ = pMVar1;
    chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_5c0,
                      (ChVector<double> *)local_4e0);
    if ((undefined1 *)
        ((long)&(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
                _vptr_ChElementBase + lVar43) != local_260) {
      plVar2 = (long *)((long)(this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                              m_storage.m_data.array + lVar40 + -0x60);
      *plVar2 = local_260._0_8_;
      plVar2[1] = local_260._8_8_;
      *(undefined8 *)
       ((long)(this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
              m_storage.m_data.array + lVar40 + -0x50) = local_260._16_8_;
    }
    lVar40 = lVar40 + 0x18;
    lVar43 = lVar43 + 0x18;
    lVar46 = lVar46 + 0x48;
  }
  GetNodeA((ChElementShellReissner4 *)local_4e0);
  uVar34 = local_4e0._0_8_;
  GetNodeD((ChElementShellReissner4 *)local_260);
  dVar51 = *(double *)(uVar34 + 0x30);
  dVar5 = *(double *)(local_260._0_8_ + 0x30);
  dVar30 = *(double *)(uVar34 + 0x20);
  dVar31 = *(double *)(uVar34 + 0x28);
  dVar32 = *(double *)(local_260._0_8_ + 0x20);
  dVar33 = *(double *)(local_260._0_8_ + 0x28);
  GetNodeB((ChElementShellReissner4 *)local_5c0);
  uVar34 = local_5c0._0_8_;
  GetNodeC((ChElementShellReissner4 *)local_610);
  auVar35._8_8_ = (dVar31 + dVar33) * 0.5;
  auVar35._0_8_ = (dVar30 + dVar32) * 0.5;
  auVar58._0_8_ =
       (*(double *)(uVar34 + 0x20) + (double)*(_func_int **)(local_610._0_8_ + 0x20)) * 0.5;
  auVar58._8_8_ =
       (*(double *)(uVar34 + 0x28) + (double)*(_func_int **)(local_610._0_8_ + 0x28)) * 0.5;
  auVar22 = vsubpd_avx(auVar35,auVar58);
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.m_data.array[2] =
       (dVar51 + dVar5) * 0.5 -
       (*(double *)(uVar34 + 0x30) + (double)*(_func_int **)(local_610._0_8_ + 0x30)) * 0.5;
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.m_data.array[0] =
       auVar22._0_8_;
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.m_data.array[1] =
       auVar22._8_8_;
  dVar51 = ChVector<double>::Length((ChVector<double> *)&local_400);
  this->m_lenX = dVar51;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_610 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_5c0 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_260 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_4e0 + 8));
  GetNodeA((ChElementShellReissner4 *)local_4e0);
  uVar34 = local_4e0._0_8_;
  GetNodeB((ChElementShellReissner4 *)local_260);
  dVar51 = *(double *)(uVar34 + 0x30);
  dVar5 = *(double *)(local_260._0_8_ + 0x30);
  dVar30 = *(double *)(uVar34 + 0x20);
  dVar31 = *(double *)(uVar34 + 0x28);
  dVar32 = *(double *)(local_260._0_8_ + 0x20);
  dVar33 = *(double *)(local_260._0_8_ + 0x28);
  GetNodeD((ChElementShellReissner4 *)local_5c0);
  uVar34 = local_5c0._0_8_;
  GetNodeC((ChElementShellReissner4 *)local_610);
  auVar36._8_8_ = (dVar31 + dVar33) * 0.5;
  auVar36._0_8_ = (dVar30 + dVar32) * 0.5;
  auVar59._0_8_ =
       (*(double *)(uVar34 + 0x20) + (double)*(_func_int **)(local_610._0_8_ + 0x20)) * 0.5;
  auVar59._8_8_ =
       (*(double *)(uVar34 + 0x28) + (double)*(_func_int **)(local_610._0_8_ + 0x28)) * 0.5;
  auVar22 = vsubpd_avx(auVar36,auVar59);
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.m_data.array[2] =
       (dVar51 + dVar5) * 0.5 -
       (*(double *)(uVar34 + 0x30) + (double)*(_func_int **)(local_610._0_8_ + 0x30)) * 0.5;
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.m_data.array[0] =
       auVar22._0_8_;
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.m_data.array[1] =
       auVar22._8_8_;
  dVar51 = ChVector<double>::Length((ChVector<double> *)&local_400);
  this->m_lenY = dVar51;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_610 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_5c0 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_260 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_4e0 + 8));
  ComputeMassMatrix(this);
  return;
}

Assistant:

void ChElementShellReissner4::SetupInitial(ChSystem* system) {
    // Align initial pos/rot of nodes to actual pos/rot
    SetAsNeutral();

    ComputeInitialNodeOrientation();
    // 	UpdateNodalAndAveragePosAndOrientation();
    // 	InterpolateOrientation();
    // copy ref values
    T0_overline = T_overline;
    T_0_0 = T_0;
    for (int i = 0; i < NUMNODES; i++) {
        xa_0[i] = xa[i];
    }
    for (int i = 0; i < NUMIP; i++) {
        T_0_i[i] = T_i[i];
    }
    for (int i = 0; i < NUMSSEP; i++) {
        T_0_A[i] = T_A[i];
    }

    ChMatrixNM<double, 4, 4> M_0;
    ChMatrixNM<double, 4, 4> M_0_Inv;
    {
        ChVector<> x_1 = InterpDeriv_xi1(xa, xi_0);
        ChVector<> x_2 = InterpDeriv_xi2(xa, xi_0);
        S_alpha_beta_0(0, 0) = T_0_0.Get_A_Xaxis() ^ x_1;
        S_alpha_beta_0(1, 0) = T_0_0.Get_A_Yaxis() ^ x_1;
        S_alpha_beta_0(0, 1) = T_0_0.Get_A_Xaxis() ^ x_2;
        S_alpha_beta_0(1, 1) = T_0_0.Get_A_Yaxis() ^ x_2;
        alpha_0 = S_alpha_beta_0(0, 0) * S_alpha_beta_0(1, 1) - S_alpha_beta_0(0, 1) * S_alpha_beta_0(1, 0);

        M_0(0, 0) = S_alpha_beta_0(0, 0) * S_alpha_beta_0(0, 0);
        M_0(0, 1) = S_alpha_beta_0(0, 1) * S_alpha_beta_0(0, 1);
        M_0(0, 2) = S_alpha_beta_0(0, 1) * S_alpha_beta_0(0, 0);
        M_0(0, 3) = S_alpha_beta_0(0, 0) * S_alpha_beta_0(0, 1);

        M_0(1, 0) = S_alpha_beta_0(1, 0) * S_alpha_beta_0(1, 0);
        M_0(1, 1) = S_alpha_beta_0(1, 1) * S_alpha_beta_0(1, 1);
        M_0(1, 2) = S_alpha_beta_0(1, 1) * S_alpha_beta_0(1, 0);
        M_0(1, 3) = S_alpha_beta_0(1, 0) * S_alpha_beta_0(1, 1);

        M_0(2, 0) = S_alpha_beta_0(0, 0) * S_alpha_beta_0(1, 0);
        M_0(2, 1) = S_alpha_beta_0(0, 1) * S_alpha_beta_0(1, 1);
        M_0(2, 2) = S_alpha_beta_0(0, 0) * S_alpha_beta_0(1, 1);
        M_0(2, 3) = S_alpha_beta_0(0, 1) * S_alpha_beta_0(1, 0);

        M_0(3, 0) = S_alpha_beta_0(0, 0) * S_alpha_beta_0(1, 0);
        M_0(3, 1) = S_alpha_beta_0(0, 1) * S_alpha_beta_0(1, 1);
        M_0(3, 2) = S_alpha_beta_0(0, 1) * S_alpha_beta_0(1, 0);
        M_0(3, 3) = S_alpha_beta_0(0, 0) * S_alpha_beta_0(1, 1);

        M_0_Inv = M_0.inverse();
    }

    for (int i = 0; i < NUMIP; i++) {
        ChMatrixNM<double, 4, 2> L_alpha_B_i;
        ChVector<> x_1 = InterpDeriv_xi1(xa, xi_i[i]);
        ChVector<> x_2 = InterpDeriv_xi2(xa, xi_i[i]);
        S_alpha_beta_i[i](0, 0) = T_0_i[i].Get_A_Xaxis() ^ x_1;
        S_alpha_beta_i[i](1, 0) = T_0_i[i].Get_A_Yaxis() ^ x_1;
        S_alpha_beta_i[i](0, 1) = T_0_i[i].Get_A_Xaxis() ^ x_2;
        S_alpha_beta_i[i](1, 1) = T_0_i[i].Get_A_Yaxis() ^ x_2;
        // alpha_i = det(S_alpha_beta_i)
        alpha_i[i] =
            S_alpha_beta_i[i](0, 0) * S_alpha_beta_i[i](1, 1) - S_alpha_beta_i[i](0, 1) * S_alpha_beta_i[i](1, 0);

        ChMatrixNM<double, 2, 2> xi_i_i;
        xi_i_i = S_alpha_beta_i[i].inverse();

        for (int n = 0; n < NUMNODES; n++) {
            for (int ii = 0; ii < 2; ii++) {
                L_alpha_B_i(n, ii) = LI_J[n][ii](xi_i[i]);
            }
        }

        L_alpha_beta_i[i] = L_alpha_B_i * xi_i_i;

        double t = xi_i[i][0] * xi_i[i][1];
        ChMatrixNM<double, 4, IDOFS> H;
        H.setZero();

        H(0, 0) = xi_i[i][0];
        H(0, 1) = t;

        H(1, 2) = xi_i[i][1];
        H(1, 3) = t;

        H(2, 4) = xi_i[i][0];
        H(2, 5) = t;

        H(3, 6) = xi_i[i][1];
        H(3, 5) = t;

        ChMatrixNM<double, 12, 4> Perm;
        Perm.setZero();

        // 1, 5, 4, 2, 3, 6
        Perm(0, 0) = 1.;
        Perm(1, 2) = 1.;
        Perm(3, 3) = 1.;
        Perm(4, 1) = 1.;

        ChMatrixNM<double, 4, IDOFS> tmpP = M_0_Inv.transpose() * H;

        P_i[i] = (alpha_0 / alpha_i[i]) * Perm * tmpP;
    }
    // save initial axial values
    ComputeIPCurvature();
    for (int i = 0; i < NUMIP; i++) {
        InterpDeriv(xa, L_alpha_beta_i[i], y_i_1[i], y_i_2[i]);
        eps_tilde_1_0_i[i] = T_i[i].transpose() * y_i_1[i];
        eps_tilde_2_0_i[i] = T_i[i].transpose() * y_i_2[i];
        k_tilde_1_0_i[i] = T_i[i].transpose() * k_1_i[i];
        k_tilde_2_0_i[i] = T_i[i].transpose() * k_2_i[i];
    }
    for (int i = 0; i < NUMSSEP; i++) {
        ChMatrixNM<double, 4, 2> L_alpha_B_A;
        ChVector<> x_1 = InterpDeriv_xi1(xa, xi_A[i]);
        ChVector<> x_2 = InterpDeriv_xi2(xa, xi_A[i]);
        S_alpha_beta_A[i](0, 0) = T_0_A[i].Get_A_Xaxis() ^ x_1;
        S_alpha_beta_A[i](1, 0) = T_0_A[i].Get_A_Yaxis() ^ x_1;
        S_alpha_beta_A[i](0, 1) = T_0_A[i].Get_A_Xaxis() ^ x_2;
        S_alpha_beta_A[i](1, 1) = T_0_A[i].Get_A_Yaxis() ^ x_2;

        ChVector<> y_A_1;
        ChVector<> y_A_2;
        InterpDeriv(xa, L_alpha_beta_A[i], y_A_1, y_A_2);
        eps_tilde_1_0_A[i] = T_A[i].transpose() * y_A_1;
        eps_tilde_2_0_A[i] = T_A[i].transpose() * y_A_2;

        // xi_A_i = S_alpha_beta_A^{-1}
        ChMatrixNM<double, 2, 2> xi_A_i;
        xi_A_i = S_alpha_beta_A[i].inverse();

        for (int n = 0; n < NUMNODES; n++) {
            for (int ii = 0; ii < 2; ii++) {
                L_alpha_B_A(n, ii) = LI_J[n][ii](xi_A[i]);
            }
        }

        L_alpha_beta_A[i] = L_alpha_B_A * xi_A_i;
    }
    {
        ChVector<> y_A_1;
        ChVector<> y_A_2;
        for (int i = 0; i < NUMSSEP; i++) {
            InterpDeriv(xa, L_alpha_beta_A[i], y_A_1, y_A_2);
            eps_tilde_1_0_A[i] = T_A[i].transpose() * y_A_1;
            eps_tilde_2_0_A[i] = T_A[i].transpose() * y_A_2;
        }
    }

    // Perform layer initialization
    for (size_t kl = 0; kl < m_layers.size(); kl++) {
        m_layers[kl].SetupInitial();
    }

    // compute initial sizes (just for auxiliary information)
    m_lenX =
        (0.5 * (GetNodeA()->coord.pos + GetNodeD()->coord.pos) - 0.5 * (GetNodeB()->coord.pos + GetNodeC()->coord.pos))
            .Length();
    m_lenY =
        (0.5 * (GetNodeA()->coord.pos + GetNodeB()->coord.pos) - 0.5 * (GetNodeD()->coord.pos + GetNodeC()->coord.pos))
            .Length();

    // Compute mass matrix
    ComputeMassMatrix();
}